

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::task_pool::process_task(task_pool *this,task *tsk)

{
  atomic32_t aVar1;
  semaphore *in_RSI;
  long in_RDI;
  
  if (((ulong)in_RSI[3].m_sem & 1) == 0) {
    (*(code *)in_RSI[2].m_sem)(in_RSI->m_sem,in_RSI[1].m_sem);
  }
  else {
    (*(code *)**(undefined8 **)in_RSI[2].m_sem)(in_RSI[2].m_sem,in_RSI->m_sem,in_RSI[1].m_sem);
  }
  aVar1 = atomic_increment32((atomic32_t *)(in_RDI + 0x2b0));
  if (aVar1 == *(long *)(in_RDI + 0x2a8)) {
    semaphore::try_release(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void task_pool::process_task(task& tsk) {
  if (tsk.m_flags & cTaskFlagObject)
    tsk.m_pObj->execute_task(tsk.m_data, tsk.m_pData_ptr);
  else
    tsk.m_callback(tsk.m_data, tsk.m_pData_ptr);

  if (atomic_increment32(&m_total_completed_tasks) == m_total_submitted_tasks) {
    // Try to signal the semaphore (the max count is 1 so this may actually fail).
    m_all_tasks_completed.try_release();
  }
}